

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  char cVar1;
  curl_trc_feat *pcVar2;
  unsigned_short uVar3;
  resolve_t rVar4;
  CURLcode CVar5;
  uint uVar6;
  if2ip_result_t iVar7;
  int iVar8;
  size_t __n;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  long lVar12;
  char cVar13;
  ushort uVar14;
  connectdata *conn;
  uint uVar15;
  char *pcVar16;
  Curl_addrinfo *ai;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  uint local_6a0;
  undefined4 local_69c;
  connectdata *local_698;
  Curl_dns_entry *dns_entry;
  uint local_684;
  pingpong *local_680;
  char myhost [47];
  Curl_sockaddr_storage ss;
  char target [67];
  char ipstr [50];
  char buffer [256];
  char hbuf [1025];
  
  conn = data->conn;
  portsock = -1;
  myhost[0x20] = '\0';
  myhost[0x21] = '\0';
  myhost[0x22] = '\0';
  myhost[0x23] = '\0';
  myhost[0x24] = '\0';
  myhost[0x25] = '\0';
  myhost[0x26] = '\0';
  myhost[0x27] = '\0';
  myhost[0x28] = '\0';
  myhost[0x29] = '\0';
  myhost[0x2a] = '\0';
  myhost[0x2b] = '\0';
  myhost[0x2c] = '\0';
  myhost[0x2d] = '\0';
  myhost[0x2e] = '\0';
  myhost[0x10] = '\0';
  myhost[0x11] = '\0';
  myhost[0x12] = '\0';
  myhost[0x13] = '\0';
  myhost[0x14] = '\0';
  myhost[0x15] = '\0';
  myhost[0x16] = '\0';
  myhost[0x17] = '\0';
  myhost[0x18] = '\0';
  myhost[0x19] = '\0';
  myhost[0x1a] = '\0';
  myhost[0x1b] = '\0';
  myhost[0x1c] = '\0';
  myhost[0x1d] = '\0';
  myhost[0x1e] = '\0';
  myhost[0x1f] = '\0';
  myhost[0] = '\0';
  myhost[1] = '\0';
  myhost[2] = '\0';
  myhost[3] = '\0';
  myhost[4] = '\0';
  myhost[5] = '\0';
  myhost[6] = '\0';
  myhost[7] = '\0';
  myhost[8] = '\0';
  myhost[9] = '\0';
  myhost[10] = '\0';
  myhost[0xb] = '\0';
  myhost[0xc] = '\0';
  myhost[0xd] = '\0';
  myhost[0xe] = '\0';
  myhost[0xf] = '\0';
  pcVar16 = (data->set).str[0x24];
  dns_entry = (Curl_dns_entry *)0x0;
  if ((pcVar16 == (char *)0x0) || (__n = strlen(pcVar16), __n < 2)) {
    local_6a0 = 0;
    uVar15 = 0;
    uVar6 = local_6a0;
LAB_0012a070:
    local_6a0 = uVar6;
    sslen = 0x80;
    iVar8 = getsockname(conn->sock[0],(sockaddr *)&ss,&sslen);
    if (iVar8 != 0) {
      piVar10 = __errno_location();
      iVar8 = *piVar10;
      goto LAB_0012a098;
    }
    pcVar16 = inet_ntop((uint)ss.buffer.sa.sa_family,
                        target + (ulong)(ss.buffer.sa.sa_family == 10) * 4 + -0x7c,hbuf,0x401);
    if (pcVar16 == (char *)0x0) goto LAB_0012a194;
    local_69c = 0;
    pcVar16 = hbuf;
LAB_0012a0f4:
    local_684 = uVar15;
    rVar4 = Curl_resolv(data,pcVar16,0,false,&dns_entry);
    if (rVar4 == CURLRESOLV_PENDING) {
      Curl_resolver_wait_resolv(data,&dns_entry);
    }
    if ((dns_entry == (Curl_dns_entry *)0x0) || (ai = dns_entry->addr, ai == (Curl_addrinfo *)0x0))
    {
      pcVar9 = "failed to resolve the address provided to PORT: %s";
    }
    else {
      local_680 = (pingpong *)&conn->proto;
      iVar8 = 0;
      for (; ai != (Curl_addrinfo *)0x0; ai = ai->ai_next) {
        CVar5 = Curl_socket_open(data,ai,(Curl_sockaddr_ex *)0x0,(uint)conn->transport,&portsock);
        if (CVar5 == CURLE_OK) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
            if (data->conn == (connectdata *)0x0) {
              pcVar16 = "???";
            }
            else {
              pcVar16 = ftp_state_names[(data->conn->proto).ftpc.state];
            }
            Curl_trc_ftp(data,"[%s] ftp_state_use_port(), opened socket",pcVar16);
          }
          memcpy((sockaddr *)&ss,ai->ai_addr,(ulong)ai->ai_addrlen);
          sslen = ai->ai_addrlen;
          uVar15 = local_684;
          local_698 = conn;
          goto LAB_0012a409;
        }
        piVar10 = __errno_location();
        iVar8 = *piVar10;
      }
      pcVar16 = Curl_strerror(iVar8,buffer,0x100);
      pcVar9 = "socket failure: %s";
    }
    goto LAB_0012a18d;
  }
  if (*pcVar16 == ':') {
    __n = 0;
    pcVar9 = pcVar16;
    pcVar16 = (char *)0x0;
LAB_0012a222:
    pcVar9 = strchr(pcVar9,0x3a);
    if (pcVar9 == (char *)0x0) goto LAB_0012a30b;
    uVar11 = strtoul(pcVar9 + 1,(char **)0x0,10);
    uVar3 = curlx_ultous(uVar11);
    uVar15 = (uint)CONCAT62(extraout_var,uVar3);
    pcVar9 = strchr(pcVar9,0x2d);
    uVar6 = uVar15;
    if (pcVar9 != (char *)0x0) {
      uVar11 = strtoul(pcVar9 + 1,(char **)0x0,10);
      uVar3 = curlx_ultous(uVar11);
      uVar6 = (uint)CONCAT62(extraout_var_00,uVar3);
    }
  }
  else {
    if (*pcVar16 == '[') {
      pcVar16 = pcVar16 + 1;
      pcVar9 = strchr(pcVar16,0x5d);
      if (pcVar9 != (char *)0x0) {
        __n = (long)pcVar9 - (long)pcVar16;
        goto LAB_0012a222;
      }
      __n = 0;
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar9 = strchr(pcVar16,0x3a);
      if (pcVar9 != (char *)0x0) {
        __n = (long)pcVar9 - (long)pcVar16;
        iVar8 = inet_pton(10,pcVar16,(void *)((long)&ss.buffer + 8));
        if (iVar8 != 1) goto LAB_0012a222;
      }
    }
LAB_0012a30b:
    uVar15 = 0;
    uVar6 = 0;
  }
  if ((ushort)uVar6 < (ushort)uVar15) {
    uVar15 = 0;
    uVar6 = 0;
  }
  if (__n == 0) goto LAB_0012a070;
  if (__n < 0x32) {
    local_6a0 = uVar6;
    memcpy(ipstr,pcVar16,__n);
    ipstr[__n] = '\0';
    iVar8 = conn->remote_addr->family;
    uVar6 = Curl_ipv6_scope(&(conn->remote_addr->_sa_ex_u).addr);
    pcVar16 = ipstr;
    iVar7 = Curl_if2ip(iVar8,uVar6,conn->scope_id,ipstr,hbuf,0x401);
    local_69c = (undefined4)CONCAT71((int7)((ulong)pcVar16 >> 8),1);
    pcVar16 = ipstr;
    if (iVar7 != IF2IP_NOT_FOUND) {
      if (iVar7 == IF2IP_AF_NOT_SUPPORTED) goto LAB_0012a194;
      pcVar16 = hbuf;
      uVar6 = local_6a0;
      if (iVar7 != IF2IP_FOUND) goto LAB_0012a070;
    }
    goto LAB_0012a0f4;
  }
  goto LAB_0012a194;
LAB_0012a6fd:
  if (fcmd == DONE) goto LAB_0012a746;
  if ((((fcmd != EPRT) || (((ulong)conn->bits & 0x10000) != 0)) &&
      (fcmd != PORT || ss.buffer.sa.sa_family == 2)) && ((ss.buffer.sa.sa_family | 8) == 10)) {
    if (fcmd == EPRT) {
      iVar8 = 0;
      CVar5 = Curl_pp_sendf(data,local_680,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                            (ulong)((ss.buffer.sa.sa_family != 2) + 1),myhost,
                            (uint)(ushort)(ss.buffer.sa_in.sin_port << 8 |
                                          ss.buffer.sa_in.sin_port >> 8));
      if (CVar5 != CURLE_OK) {
        pcVar16 = curl_easy_strerror(CVar5);
        pcVar9 = "Failure sending EPRT command: %s";
LAB_0012a611:
        Curl_failf(data,pcVar9,pcVar16);
        goto LAB_0012a197;
      }
    }
    else {
      if (fcmd != PORT) goto LAB_0012a741;
      lVar12 = 0;
      while( true ) {
        cVar1 = myhost[lVar12];
        cVar13 = ',';
        if ((cVar1 != '.') && (cVar13 = cVar1, cVar1 == '\0')) break;
        target[lVar12] = cVar13;
        lVar12 = lVar12 + 1;
      }
      target[lVar12] = '\0';
      curl_msnprintf(target + lVar12,0x14,",%d,%d",(ulong)(ss.buffer.sa_in.sin_port & 0xff),
                     (ulong)(byte)((ushort)ss.buffer._2_2_ >> 8));
      CVar5 = Curl_pp_sendf(data,local_680,"%s %s",0x16ef69,target);
      conn = local_698;
      if (CVar5 != CURLE_OK) {
        pcVar16 = curl_easy_strerror(CVar5);
        Curl_failf(data,"Failure sending PORT command: %s",pcVar16);
        conn = local_698;
        goto LAB_0012a197;
      }
    }
    goto LAB_0012a748;
  }
LAB_0012a741:
  fcmd = fcmd + PORT;
  goto LAB_0012a6fd;
LAB_0012a746:
  iVar8 = 2;
LAB_0012a748:
  (conn->proto).ftpc.count1 = iVar8;
  _ftp_state(data,'\x1c');
  CVar5 = CURLE_OK;
  goto LAB_0012a197;
  while( true ) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar16 = Curl_strerror(99,buffer,0x100);
      Curl_infof(data,"bind(port=%hu) on non-local address failed: %s",(ulong)uVar6,pcVar16);
    }
    conn = local_698;
    sslen = 0x80;
    iVar8 = getsockname(local_698->sock[0],(sockaddr *)&ss,&sslen);
    local_69c = 0;
    uVar15 = local_684;
    if (iVar8 != 0) break;
LAB_0012a409:
    uVar14 = (ushort)uVar15;
    if ((ushort)local_6a0 < uVar14) {
      Curl_failf(data,"bind() failed, we ran out of ports");
      conn = local_698;
      goto LAB_0012a194;
    }
    ss.buffer.sa_in.sin_port = uVar14 << 8 | uVar14 >> 8;
    iVar8 = bind(portsock,(sockaddr *)&ss,sslen);
    uVar6 = uVar15 & 0xffff;
    if (iVar8 == 0) {
      sslen = 0x80;
      iVar8 = getsockname(portsock,(sockaddr *)&ss,&sslen);
      conn = local_698;
      CVar5 = CURLE_FTP_PORT_FAILED;
      if (iVar8 != 0) {
        piVar10 = __errno_location();
        pcVar16 = Curl_strerror(*piVar10,buffer,0x100);
        pcVar9 = "getsockname() failed: %s";
        goto LAB_0012a611;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
          && (0 < Curl_trc_feat_ftp.log_level)))) {
        if (data->conn == (connectdata *)0x0) {
          pcVar16 = "???";
        }
        else {
          pcVar16 = ftp_state_names[(data->conn->proto).ftpc.state];
        }
        Curl_trc_ftp(data,"[%s] ftp_state_use_port(), socket bound to port %d",pcVar16,(ulong)uVar6)
        ;
      }
      iVar8 = listen(portsock,1);
      if (iVar8 != 0) {
        piVar10 = __errno_location();
        pcVar16 = Curl_strerror(*piVar10,buffer,0x100);
        pcVar9 = "socket failure: %s";
        goto LAB_0012a611;
      }
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_ftp.log_level)) {
        if (data->conn == (connectdata *)0x0) {
          pcVar16 = "???";
        }
        else {
          pcVar16 = ftp_state_names[(data->conn->proto).ftpc.state];
        }
        Curl_trc_ftp(data,"[%s] ftp_state_use_port(), listening on %d",pcVar16,(ulong)uVar6);
      }
      Curl_printable_address(ai,myhost,0x2f);
      if ((SUB84(conn->bits,0) & 0x10800) == 0x800) {
        conn->bits = (ConnectBits)((ulong)conn->bits | 0x10000);
      }
      iVar8 = 1;
      CVar5 = Curl_conn_tcp_listen_set(data,conn,1,&portsock);
      if (CVar5 != CURLE_OK) goto LAB_0012a197;
      portsock = -1;
      goto LAB_0012a6fd;
    }
    piVar10 = __errno_location();
    iVar8 = *piVar10;
    if ((iVar8 == 99 & (byte)local_69c) != 1) {
      if ((iVar8 != 0xd) && (iVar8 != 0x62)) {
        pcVar16 = Curl_strerror(iVar8,buffer,0x100);
        Curl_failf(data,"bind(port=%hu) failed: %s",(ulong)uVar6,pcVar16);
        conn = local_698;
        goto LAB_0012a194;
      }
      uVar15 = uVar15 + 1;
      goto LAB_0012a409;
    }
  }
  iVar8 = *piVar10;
LAB_0012a098:
  pcVar16 = Curl_strerror(iVar8,buffer,0x100);
  pcVar9 = "getsockname() failed: %s";
LAB_0012a18d:
  Curl_failf(data,pcVar9,pcVar16);
LAB_0012a194:
  CVar5 = CURLE_FTP_PORT_FAILED;
LAB_0012a197:
  if (dns_entry != (Curl_dns_entry *)0x0) {
    Curl_resolv_unlink(data,&dns_entry);
  }
  if (CVar5 != CURLE_OK) {
    _ftp_state(data,'\0');
  }
  if (portsock != -1) {
    Curl_socket_close(data,conn,portsock);
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_FTP_PORT_FAILED;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef USE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *dns_entry = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;
  size_t addrlen = 0;
  char ipstr[50];

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {
    char *ip_end = NULL;

#ifdef USE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      char *ip_start = string_ftpport + 1;
      ip_end = strchr(ip_start, ']');
      if(ip_end) {
        addrlen = ip_end - ip_start;
        addr = ip_start;
      }
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        addr = string_ftpport;
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
          addrlen = ip_end - string_ftpport;
#ifdef USE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, &sa6->sin6_addr) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            ip_end = NULL; /* this got no port ! */
          }
#endif
        }
        else
          /* ipv4|interface */
          addrlen = strlen(string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      char *port_sep = NULL;
      char *port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;

    if(addrlen) {
      DEBUGASSERT(addr);
      if(addrlen >= sizeof(ipstr))
        goto out;
      memcpy(ipstr, addr, addrlen);
      ipstr[addrlen] = 0;

      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->remote_addr->family,
#ifdef USE_IPV6
                        Curl_ipv6_scope(&conn->remote_addr->curl_sa_addr),
                        conn->scope_id,
#endif
                        ipstr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as hostname instead */
          host = ipstr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          goto out;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for hostname */
          break;
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a hostname, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      goto out;
    }
    switch(sa->sa_family) {
#ifdef USE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r) {
      goto out;
    }
    host = hbuf; /* use this hostname */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &dns_entry);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &dns_entry);
  if(dns_entry) {
    res = dns_entry->addr;
  }
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    goto out;
  }

  host = NULL;

  /* step 2, create a socket for the requested address */
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    if(Curl_socket_open(data, ai, NULL, conn->transport, &portsock)) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), opened socket",
               FTP_DSTATE(data));

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef USE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local. Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          goto out;
        }
        port = port_min;
        possibly_non_local = FALSE; /* do not try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        goto out;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already */
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    goto out;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), socket bound to port %d",
               FTP_DSTATE(data), port);

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), listening on %d",
               FTP_DSTATE(data), port);

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef USE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  /* Replace any filter on SECONDARY with one listening on this socket */
  result = Curl_conn_tcp_listen_set(data, conn, SECONDARYSOCKET, &portsock);
  if(result)
    goto out;
  portsock = CURL_SOCKET_BAD; /* now held in filter */

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef USE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET ? 1 : 2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(*source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port >> 8), (int)(port & 0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  ftp_state(data, FTP_PORT);

out:
  /* If we looked up a dns_entry, now is the time to safely release it */
  if(dns_entry)
    Curl_resolv_unlink(data, &dns_entry);
  if(result) {
    ftp_state(data, FTP_STOP);
  }
  if(portsock != CURL_SOCKET_BAD)
    Curl_socket_close(data, conn, portsock);
  return result;
}